

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::ColumnCryptoMetaData
          (ColumnCryptoMetaData *this,ColumnCryptoMetaData *other136)

{
  _EncryptionWithColumnKey__isset *p_Var1;
  
  *(undefined ***)this = &PTR__ColumnCryptoMetaData_024848e8;
  this->ENCRYPTION_WITH_FOOTER_KEY = (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_02484818
  ;
  *(undefined ***)&this->ENCRYPTION_WITH_COLUMN_KEY = &PTR__EncryptionWithColumnKey_02484880;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata._M_dataplus._M_p =
       (pointer)&(this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata.field_2;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata._M_string_length = 0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ENCRYPTION_WITH_COLUMN_KEY).__isset;
  *p_Var1 = (_EncryptionWithColumnKey__isset)((byte)*p_Var1 & 0xfe);
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset & 0xfc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema,
              &(other136->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::__cxx11::string::_M_assign((string *)&(this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata);
  (this->ENCRYPTION_WITH_COLUMN_KEY).__isset = (other136->ENCRYPTION_WITH_COLUMN_KEY).__isset;
  this->__isset = other136->__isset;
  return;
}

Assistant:

ColumnCryptoMetaData::ColumnCryptoMetaData(const ColumnCryptoMetaData& other136) {
  ENCRYPTION_WITH_FOOTER_KEY = other136.ENCRYPTION_WITH_FOOTER_KEY;
  ENCRYPTION_WITH_COLUMN_KEY = other136.ENCRYPTION_WITH_COLUMN_KEY;
  __isset = other136.__isset;
}